

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int __thiscall QuantNet::save_table(QuantNet *this,char *tablepath)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int j_1;
  pointer pMVar5;
  int j;
  long lVar6;
  
  __stream = fopen(tablepath,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",tablepath);
    iVar1 = -1;
  }
  else {
    uVar3 = (ulong)((long)(this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    uVar2 = (ulong)((long)(this->conv_bottom_blobs).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->conv_bottom_blobs).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 2;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
      pMVar5 = (this->weight_scales).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar3;
      fprintf(__stream,"%s_param_0 ",
              ((this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_start
               [(this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3]]->name)._M_dataplus._M_p);
      for (lVar6 = 0; lVar6 < pMVar5->w; lVar6 = lVar6 + 1) {
        fprintf(__stream,"%f ",(double)*(float *)((long)pMVar5->data + lVar6 * 4));
      }
      fputc(10,__stream);
    }
    uVar3 = uVar2 & 0xffffffff;
    if ((int)uVar2 < 1) {
      uVar3 = 0;
    }
    for (uVar2 = 0; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      pMVar5 = (this->bottom_blob_scales).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar2;
      fprintf(__stream,"%s ",
              ((this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
               _M_impl.super__Vector_impl_data._M_start
               [(this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2]]->name)._M_dataplus._M_p);
      for (lVar6 = 0; lVar6 < pMVar5->w; lVar6 = lVar6 + 1) {
        fprintf(__stream,"%f ",(double)*(float *)((long)pMVar5->data + lVar6 * 4));
      }
      fputc(10,__stream);
    }
    fclose(__stream);
    fwrite("ncnn int8 calibration table create success, best wish for your int8 inference has a low accuracy loss...\\(^0^)/...233...\n"
           ,0x79,1,_stderr);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int QuantNet::save_table(const char* tablepath)
{
    FILE* fp = fopen(tablepath, "wb");
    if (!fp)
    {
        fprintf(stderr, "fopen %s failed\n", tablepath);
        return -1;
    }

    const int conv_layer_count = (int)conv_layers.size();
    const int conv_bottom_blob_count = (int)conv_bottom_blobs.size();

    for (int i = 0; i < conv_layer_count; i++)
    {
        const ncnn::Mat& weight_scale = weight_scales[i];

        fprintf(fp, "%s_param_0 ", layers[conv_layers[i]]->name.c_str());
        for (int j = 0; j < weight_scale.w; j++)
        {
            fprintf(fp, "%f ", weight_scale[j]);
        }
        fprintf(fp, "\n");
    }

    for (int i = 0; i < conv_bottom_blob_count; i++)
    {
        const ncnn::Mat& bottom_blob_scale = bottom_blob_scales[i];

        fprintf(fp, "%s ", layers[conv_layers[i]]->name.c_str());
        for (int j = 0; j < bottom_blob_scale.w; j++)
        {
            fprintf(fp, "%f ", bottom_blob_scale[j]);
        }
        fprintf(fp, "\n");
    }

    fclose(fp);

    fprintf(stderr, "ncnn int8 calibration table create success, best wish for your int8 inference has a low accuracy loss...\\(^0^)/...233...\n");

    return 0;
}